

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QPoint *pos)

{
  Picker *this_00;
  ulong uVar1;
  QModelIndex index;
  QString local_50;
  QModelIndex local_38;
  
  indexForPos(&local_38,this,pos);
  if (local_38.m != (QAbstractItemModel *)0x0 && -1 < (local_38.c | local_38.r)) {
    uVar1 = (**(code **)(*(long *)local_38.m + 0x138))(local_38.m,&local_38);
    if ((uVar1 & 0x20) != 0) {
      setCurrentIndex(this,&local_38);
      this_00 = this->q;
      itemText(&local_50,this,&local_38);
      Picker::activated(this_00,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
        }
      }
      Picker::activated(this->q,local_38.r);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QPoint & pos )
{
	const QModelIndex index = indexForPos( pos );

	if( index.isValid() && ( index.flags() & Qt::ItemIsEnabled ) )
	{
		setCurrentIndex( index );
		emit q->activated( itemText( index ) );
		emit q->activated( index.row() );
	}
}